

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpainter.cpp
# Opt level: O0

void __thiscall
VPainter::drawBitmap(VPainter *this,VRect *target,VBitmap *bitmap,VRect *source,uint8_t const_alpha)

{
  bool bVar1;
  VSize this_00;
  VSize source_00;
  VPainter *in_RDI;
  VBrush *in_stack_ffffffffffffffa8;
  uint8_t const_alpha_00;
  VRect *in_stack_ffffffffffffffb8;
  VRect *in_stack_ffffffffffffffc8;
  VPainter *in_stack_ffffffffffffffd0;
  
  bVar1 = VBitmap::valid((VBitmap *)0x1175f3);
  if (bVar1) {
    VBrush::VBrush((VBrush *)in_RDI);
    setBrush(in_RDI,in_stack_ffffffffffffffa8);
    const_alpha_00 = (uint8_t)((ulong)in_RDI >> 0x38);
    this_00 = VRect::size(in_stack_ffffffffffffffb8);
    source_00 = VRect::size(in_stack_ffffffffffffffb8);
    bVar1 = VSize::operator==((VSize *)this_00,(VSize *)source_00);
    if (bVar1) {
      drawBitmapUntransform
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(VBitmap *)this_00,
                 (VRect *)source_00,const_alpha_00);
    }
  }
  return;
}

Assistant:

void VPainter::drawBitmap(const VRect &target, const VBitmap &bitmap,
                          const VRect &source, uint8_t const_alpha)
{
    if (!bitmap.valid()) return;

    // clear any existing brush data.
    setBrush(VBrush());

    if (target.size() == source.size()) {
        drawBitmapUntransform(target, bitmap, source, const_alpha);
    } else {
        // @TODO scaling
    }
}